

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined4 uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 (*pauVar50) [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  ulong *puVar59;
  ulong uVar60;
  ulong uVar61;
  byte bVar62;
  int iVar63;
  uint uVar64;
  long lVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar76;
  uint uVar77;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  uint uVar78;
  uint uVar82;
  undefined1 auVar75 [32];
  vint4 bi;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar95;
  float fVar96;
  vint4 ai;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar97;
  undefined1 auVar93 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [32];
  float fVar101;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar110;
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar112 [32];
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar141 [32];
  NodeRef stack [244];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [32];
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar59 = local_7f8;
  local_800 = root.ptr;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar67._4_4_ = uVar3;
  auVar67._0_4_ = uVar3;
  auVar67._8_4_ = uVar3;
  auVar67._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar68._4_4_ = uVar3;
  auVar68._0_4_ = uVar3;
  auVar68._8_4_ = uVar3;
  auVar68._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar69._4_4_ = uVar3;
  auVar69._0_4_ = uVar3;
  auVar69._8_4_ = uVar3;
  auVar69._12_4_ = uVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar63 = (tray->tnear).field_0.i[k];
  auVar70._4_4_ = iVar63;
  auVar70._0_4_ = iVar63;
  auVar70._8_4_ = iVar63;
  auVar70._12_4_ = iVar63;
  iVar63 = (tray->tfar).field_0.i[k];
  auVar71._4_4_ = iVar63;
  auVar71._0_4_ = iVar63;
  auVar71._8_4_ = iVar63;
  auVar71._12_4_ = iVar63;
  bVar66 = true;
  do {
    uVar61 = puVar59[-1];
    puVar59 = puVar59 + -1;
    while ((uVar61 & 8) == 0) {
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar54),auVar67);
      auVar93._0_4_ = auVar72._0_4_ * fVar4;
      auVar93._4_4_ = auVar72._4_4_ * fVar4;
      auVar93._8_4_ = auVar72._8_4_ * fVar4;
      auVar93._12_4_ = auVar72._12_4_ * fVar4;
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar58),auVar68);
      auVar83._0_4_ = auVar72._0_4_ * fVar5;
      auVar83._4_4_ = auVar72._4_4_ * fVar5;
      auVar83._8_4_ = auVar72._8_4_ * fVar5;
      auVar83._12_4_ = auVar72._12_4_ * fVar5;
      auVar72 = vpmaxsd_avx(auVar93,auVar83);
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar60),auVar69);
      auVar84._0_4_ = auVar93._0_4_ * fVar6;
      auVar84._4_4_ = auVar93._4_4_ * fVar6;
      auVar84._8_4_ = auVar93._8_4_ * fVar6;
      auVar84._12_4_ = auVar93._12_4_ * fVar6;
      auVar93 = vpmaxsd_avx(auVar84,auVar70);
      auVar72 = vpmaxsd_avx(auVar72,auVar93);
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar54 ^ 0x10)),auVar67);
      auVar85._0_4_ = auVar93._0_4_ * fVar4;
      auVar85._4_4_ = auVar93._4_4_ * fVar4;
      auVar85._8_4_ = auVar93._8_4_ * fVar4;
      auVar85._12_4_ = auVar93._12_4_ * fVar4;
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar58 ^ 0x10)),auVar68);
      auVar91._0_4_ = auVar93._0_4_ * fVar5;
      auVar91._4_4_ = auVar93._4_4_ * fVar5;
      auVar91._8_4_ = auVar93._8_4_ * fVar5;
      auVar91._12_4_ = auVar93._12_4_ * fVar5;
      auVar93 = vpminsd_avx(auVar85,auVar91);
      auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar60 ^ 0x10)),auVar69);
      auVar92._0_4_ = auVar83._0_4_ * fVar6;
      auVar92._4_4_ = auVar83._4_4_ * fVar6;
      auVar92._8_4_ = auVar83._8_4_ * fVar6;
      auVar92._12_4_ = auVar83._12_4_ * fVar6;
      auVar83 = vpminsd_avx(auVar92,auVar71);
      auVar93 = vpminsd_avx(auVar93,auVar83);
      auVar72 = vpcmpgtd_avx(auVar72,auVar93);
      iVar63 = vmovmskps_avx(auVar72);
      if (iVar63 == 0xf) goto LAB_003998b7;
      bVar62 = (byte)iVar63 ^ 0xf;
      uVar55 = uVar61 & 0xfffffffffffffff0;
      lVar56 = 0;
      if (bVar62 != 0) {
        for (; (bVar62 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
        }
      }
      uVar61 = *(ulong *)(uVar55 + lVar56 * 8);
      uVar64 = bVar62 - 1 & (uint)bVar62;
      if (uVar64 != 0) {
        *puVar59 = uVar61;
        puVar59 = puVar59 + 1;
        lVar56 = 0;
        if (uVar64 != 0) {
          for (; (uVar64 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
          }
        }
        uVar61 = *(ulong *)(uVar55 + lVar56 * 8);
        uVar64 = uVar64 - 1 & uVar64;
        uVar57 = (ulong)uVar64;
        if (uVar64 != 0) {
          do {
            *puVar59 = uVar61;
            puVar59 = puVar59 + 1;
            lVar56 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
            uVar61 = *(ulong *)(uVar55 + lVar56 * 8);
            uVar57 = uVar57 & uVar57 - 1;
          } while (uVar57 != 0);
        }
      }
    }
    uVar55 = (ulong)((uint)uVar61 & 0xf);
    if (uVar55 != 8) {
      uVar3 = *(undefined4 *)(ray + k * 4);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x40);
      fVar9 = *(float *)(ray + k * 4 + 0x80);
      fVar10 = *(float *)(ray + k * 4 + 0xa0);
      uVar61 = uVar61 & 0xfffffffffffffff0;
      fVar11 = *(float *)(ray + k * 4 + 0xc0);
      lVar56 = 0;
      do {
        lVar65 = lVar56 * 0xe0;
        lVar1 = uVar61 + 0xc0 + lVar65;
        local_820 = *(undefined8 *)(lVar1 + 0x10);
        uStack_818 = *(undefined8 *)(lVar1 + 0x18);
        uStack_810 = local_820;
        uStack_808 = uStack_818;
        auVar126._16_16_ = *(undefined1 (*) [16])(uVar61 + 0x60 + lVar65);
        auVar126._0_16_ = *(undefined1 (*) [16])(uVar61 + lVar65);
        auVar72 = *(undefined1 (*) [16])(uVar61 + 0x70 + lVar65);
        auVar102._16_16_ = auVar72;
        auVar102._0_16_ = *(undefined1 (*) [16])(uVar61 + 0x10 + lVar65);
        puVar2 = (undefined8 *)(uVar61 + 0x80 + lVar65);
        local_a40._24_8_ = puVar2[1];
        local_a40._16_8_ = *puVar2;
        local_a40._0_16_ = *(undefined1 (*) [16])(uVar61 + 0x20 + lVar65);
        auVar93 = *(undefined1 (*) [16])(uVar61 + 0x30 + lVar65);
        auVar73._16_16_ = auVar93;
        auVar73._0_16_ = auVar93;
        auVar93 = *(undefined1 (*) [16])(uVar61 + 0x40 + lVar65);
        auVar86._16_16_ = auVar93;
        auVar86._0_16_ = auVar93;
        auVar93 = *(undefined1 (*) [16])(uVar61 + 0x50 + lVar65);
        auVar94._16_16_ = auVar93;
        auVar94._0_16_ = auVar93;
        lVar1 = uVar61 + 0x90 + lVar65;
        pauVar50 = (undefined1 (*) [16])(lVar1 + 0x10);
        uStack_a70 = *(undefined8 *)*pauVar50;
        _local_a80 = *pauVar50;
        uStack_a68 = *(undefined8 *)(lVar1 + 0x18);
        auVar93 = *(undefined1 (*) [16])(uVar61 + 0xa0 + lVar65);
        auVar141._16_16_ = auVar93;
        auVar141._0_16_ = auVar93;
        lVar65 = uVar61 + 0xb0 + lVar65;
        pauVar50 = (undefined1 (*) [16])(lVar65 + 0x10);
        uStack_a48 = *(undefined8 *)(lVar65 + 0x18);
        uStack_a50 = *(undefined8 *)*pauVar50;
        _local_a60 = *pauVar50;
        auVar73 = vsubps_avx(auVar126,auVar73);
        auVar34 = vsubps_avx(auVar102,auVar86);
        auVar35 = vsubps_avx(local_a40,auVar94);
        auVar36 = vsubps_avx(_local_a80,auVar126);
        auVar37 = vsubps_avx(auVar141,auVar102);
        auVar38 = vsubps_avx(_local_a60,local_a40);
        fVar13 = auVar38._0_4_;
        fVar134 = auVar34._0_4_;
        fVar16 = auVar38._4_4_;
        fVar135 = auVar34._4_4_;
        fVar19 = auVar38._8_4_;
        fVar136 = auVar34._8_4_;
        fVar22 = auVar38._12_4_;
        fVar137 = auVar34._12_4_;
        fVar25 = auVar38._16_4_;
        fVar138 = auVar34._16_4_;
        fVar28 = auVar38._20_4_;
        fVar139 = auVar34._20_4_;
        fVar31 = auVar38._24_4_;
        uStack_a68._4_4_ = (undefined4)((ulong)uStack_a48 >> 0x20);
        fVar140 = auVar34._24_4_;
        local_a80._4_4_ = fVar135 * fVar16;
        local_a80._0_4_ = fVar134 * fVar13;
        fStack_a78 = fVar136 * fVar19;
        fStack_a74 = fVar137 * fVar22;
        uStack_a70._0_4_ = fVar138 * fVar25;
        uStack_a70._4_4_ = fVar139 * fVar28;
        uStack_a68._0_4_ = fVar140 * fVar31;
        fVar14 = auVar37._0_4_;
        fVar90 = auVar35._0_4_;
        fVar17 = auVar37._4_4_;
        fVar95 = auVar35._4_4_;
        auVar34._4_4_ = fVar95 * fVar17;
        auVar34._0_4_ = fVar90 * fVar14;
        fVar20 = auVar37._8_4_;
        fVar96 = auVar35._8_4_;
        auVar34._8_4_ = fVar96 * fVar20;
        fVar23 = auVar37._12_4_;
        fVar97 = auVar35._12_4_;
        auVar34._12_4_ = fVar97 * fVar23;
        fVar26 = auVar37._16_4_;
        fVar98 = auVar35._16_4_;
        auVar34._16_4_ = fVar98 * fVar26;
        fVar29 = auVar37._20_4_;
        fVar99 = auVar35._20_4_;
        auVar34._20_4_ = fVar99 * fVar29;
        fVar32 = auVar37._24_4_;
        fVar100 = auVar35._24_4_;
        auVar34._24_4_ = fVar100 * fVar32;
        auVar34._28_4_ = uStack_a68._4_4_;
        auVar34 = vsubps_avx(auVar34,_local_a80);
        fVar15 = auVar36._0_4_;
        fVar18 = auVar36._4_4_;
        auVar37._4_4_ = fVar95 * fVar18;
        auVar37._0_4_ = fVar90 * fVar15;
        fVar21 = auVar36._8_4_;
        auVar37._8_4_ = fVar96 * fVar21;
        fVar24 = auVar36._12_4_;
        auVar37._12_4_ = fVar97 * fVar24;
        fVar27 = auVar36._16_4_;
        auVar37._16_4_ = fVar98 * fVar27;
        fVar30 = auVar36._20_4_;
        auVar37._20_4_ = fVar99 * fVar30;
        fVar33 = auVar36._24_4_;
        auVar37._24_4_ = fVar100 * fVar33;
        auVar37._28_4_ = auVar35._28_4_;
        fVar110 = auVar73._0_4_;
        fVar113 = auVar73._4_4_;
        auVar36._4_4_ = fVar113 * fVar16;
        auVar36._0_4_ = fVar110 * fVar13;
        fVar115 = auVar73._8_4_;
        auVar36._8_4_ = fVar115 * fVar19;
        fVar117 = auVar73._12_4_;
        auVar36._12_4_ = fVar117 * fVar22;
        fVar119 = auVar73._16_4_;
        auVar36._16_4_ = fVar119 * fVar25;
        fVar121 = auVar73._20_4_;
        auVar36._20_4_ = fVar121 * fVar28;
        fVar123 = auVar73._24_4_;
        auVar36._24_4_ = fVar123 * fVar31;
        auVar36._28_4_ = auVar34._28_4_;
        auVar73 = vsubps_avx(auVar36,auVar37);
        auVar38._4_4_ = fVar113 * fVar17;
        auVar38._0_4_ = fVar110 * fVar14;
        auVar38._8_4_ = fVar115 * fVar20;
        auVar38._12_4_ = fVar117 * fVar23;
        auVar38._16_4_ = fVar119 * fVar26;
        auVar38._20_4_ = fVar121 * fVar29;
        auVar38._24_4_ = fVar123 * fVar32;
        auVar38._28_4_ = auVar35._28_4_;
        auVar35._4_4_ = fVar135 * fVar18;
        auVar35._0_4_ = fVar134 * fVar15;
        auVar35._8_4_ = fVar136 * fVar21;
        auVar35._12_4_ = fVar137 * fVar24;
        auVar35._16_4_ = fVar138 * fVar27;
        auVar35._20_4_ = fVar139 * fVar30;
        auVar35._24_4_ = fVar140 * fVar33;
        auVar35._28_4_ = auVar73._28_4_;
        auVar36 = vsubps_avx(auVar35,auVar38);
        auVar53._4_4_ = uVar3;
        auVar53._0_4_ = uVar3;
        auVar53._8_4_ = uVar3;
        auVar53._12_4_ = uVar3;
        auVar53._16_4_ = uVar3;
        auVar53._20_4_ = uVar3;
        auVar53._24_4_ = uVar3;
        auVar53._28_4_ = uVar3;
        auVar37 = vsubps_avx(auVar126,auVar53);
        auVar52._4_4_ = uVar7;
        auVar52._0_4_ = uVar7;
        auVar52._8_4_ = uVar7;
        auVar52._12_4_ = uVar7;
        auVar52._16_4_ = uVar7;
        auVar52._20_4_ = uVar7;
        auVar52._24_4_ = uVar7;
        auVar52._28_4_ = uVar7;
        auVar35 = vsubps_avx(auVar102,auVar52);
        auVar51._4_4_ = uVar8;
        auVar51._0_4_ = uVar8;
        auVar51._8_4_ = uVar8;
        auVar51._12_4_ = uVar8;
        auVar51._16_4_ = uVar8;
        auVar51._20_4_ = uVar8;
        auVar51._24_4_ = uVar8;
        auVar51._28_4_ = uVar8;
        auVar38 = vsubps_avx(local_a40,auVar51);
        fVar101 = auVar38._0_4_;
        fVar104 = auVar38._4_4_;
        auVar39._4_4_ = fVar104 * fVar10;
        auVar39._0_4_ = fVar101 * fVar10;
        fVar105 = auVar38._8_4_;
        auVar39._8_4_ = fVar105 * fVar10;
        fVar106 = auVar38._12_4_;
        auVar39._12_4_ = fVar106 * fVar10;
        fVar107 = auVar38._16_4_;
        auVar39._16_4_ = fVar107 * fVar10;
        fVar108 = auVar38._20_4_;
        auVar39._20_4_ = fVar108 * fVar10;
        fVar109 = auVar38._24_4_;
        auVar39._24_4_ = fVar109 * fVar10;
        auVar39._28_4_ = (int)((ulong)local_a40._24_8_ >> 0x20);
        fVar125 = auVar35._0_4_;
        fVar128 = auVar35._4_4_;
        auVar41._4_4_ = fVar128 * fVar11;
        auVar41._0_4_ = fVar125 * fVar11;
        fVar129 = auVar35._8_4_;
        auVar41._8_4_ = fVar129 * fVar11;
        fVar130 = auVar35._12_4_;
        auVar41._12_4_ = fVar130 * fVar11;
        fVar131 = auVar35._16_4_;
        auVar41._16_4_ = fVar131 * fVar11;
        fVar132 = auVar35._20_4_;
        auVar41._20_4_ = fVar132 * fVar11;
        uVar40 = auVar72._12_4_;
        fVar133 = auVar35._24_4_;
        auVar41._24_4_ = fVar133 * fVar11;
        auVar41._28_4_ = uVar40;
        auVar39 = vsubps_avx(auVar41,auVar39);
        fVar111 = auVar37._0_4_;
        fVar114 = auVar37._4_4_;
        auVar42._4_4_ = fVar114 * fVar11;
        auVar42._0_4_ = fVar111 * fVar11;
        fVar116 = auVar37._8_4_;
        auVar42._8_4_ = fVar116 * fVar11;
        fVar118 = auVar37._12_4_;
        auVar42._12_4_ = fVar118 * fVar11;
        fVar120 = auVar37._16_4_;
        auVar42._16_4_ = fVar120 * fVar11;
        fVar122 = auVar37._20_4_;
        auVar42._20_4_ = fVar122 * fVar11;
        fVar124 = auVar37._24_4_;
        auVar42._24_4_ = fVar124 * fVar11;
        auVar42._28_4_ = uVar40;
        auVar44._4_4_ = fVar104 * fVar9;
        auVar44._0_4_ = fVar101 * fVar9;
        auVar44._8_4_ = fVar105 * fVar9;
        auVar44._12_4_ = fVar106 * fVar9;
        auVar44._16_4_ = fVar107 * fVar9;
        auVar44._20_4_ = fVar108 * fVar9;
        fVar43 = auVar38._28_4_;
        auVar44._24_4_ = fVar109 * fVar9;
        auVar44._28_4_ = fVar43;
        auVar38 = vsubps_avx(auVar44,auVar42);
        auVar45._4_4_ = fVar128 * fVar9;
        auVar45._0_4_ = fVar125 * fVar9;
        auVar45._8_4_ = fVar129 * fVar9;
        auVar45._12_4_ = fVar130 * fVar9;
        auVar45._16_4_ = fVar131 * fVar9;
        auVar45._20_4_ = fVar132 * fVar9;
        auVar45._24_4_ = fVar133 * fVar9;
        auVar45._28_4_ = fVar43;
        auVar47._4_4_ = fVar114 * fVar10;
        auVar47._0_4_ = fVar111 * fVar10;
        auVar47._8_4_ = fVar116 * fVar10;
        auVar47._12_4_ = fVar118 * fVar10;
        auVar47._16_4_ = fVar120 * fVar10;
        auVar47._20_4_ = fVar122 * fVar10;
        fVar46 = auVar35._28_4_;
        auVar47._24_4_ = fVar124 * fVar10;
        auVar47._28_4_ = fVar46;
        auVar35 = vsubps_avx(auVar47,auVar45);
        local_a60._0_4_ = auVar73._0_4_;
        local_a60._4_4_ = auVar73._4_4_;
        fStack_a58 = auVar73._8_4_;
        fStack_a54 = auVar73._12_4_;
        uStack_a50._0_4_ = auVar73._16_4_;
        uStack_a50._4_4_ = auVar73._20_4_;
        uStack_a48._0_4_ = auVar73._24_4_;
        local_a80._0_4_ = auVar34._0_4_;
        local_a80._4_4_ = auVar34._4_4_;
        fStack_a78 = auVar34._8_4_;
        fStack_a74 = auVar34._12_4_;
        uStack_a70._0_4_ = auVar34._16_4_;
        uStack_a70._4_4_ = auVar34._20_4_;
        uStack_a68._0_4_ = auVar34._24_4_;
        auVar127._0_4_ =
             fVar9 * (float)local_a80._0_4_ +
             fVar10 * (float)local_a60._0_4_ + auVar36._0_4_ * fVar11;
        auVar127._4_4_ =
             fVar9 * (float)local_a80._4_4_ +
             fVar10 * (float)local_a60._4_4_ + auVar36._4_4_ * fVar11;
        auVar127._8_4_ = fVar9 * fStack_a78 + fVar10 * fStack_a58 + auVar36._8_4_ * fVar11;
        auVar127._12_4_ = fVar9 * fStack_a74 + fVar10 * fStack_a54 + auVar36._12_4_ * fVar11;
        auVar127._16_4_ =
             fVar9 * (float)uStack_a70 + fVar10 * (float)uStack_a50 + auVar36._16_4_ * fVar11;
        auVar127._20_4_ =
             fVar9 * uStack_a70._4_4_ + fVar10 * uStack_a50._4_4_ + auVar36._20_4_ * fVar11;
        auVar127._24_4_ =
             fVar9 * (float)uStack_a68 + fVar10 * (float)uStack_a48 + auVar36._24_4_ * fVar11;
        auVar127._28_4_ = fVar10 + fVar10 + fVar46;
        local_a00 = auVar39._0_4_;
        fStack_9fc = auVar39._4_4_;
        fStack_9f8 = auVar39._8_4_;
        fStack_9f4 = auVar39._12_4_;
        fStack_9f0 = auVar39._16_4_;
        fStack_9ec = auVar39._20_4_;
        fStack_9e8 = auVar39._24_4_;
        auVar74._8_4_ = 0x80000000;
        auVar74._0_8_ = 0x8000000080000000;
        auVar74._12_4_ = 0x80000000;
        auVar74._16_4_ = 0x80000000;
        auVar74._20_4_ = 0x80000000;
        auVar74._24_4_ = 0x80000000;
        auVar74._28_4_ = 0x80000000;
        auVar73 = vandps_avx(auVar127,auVar74);
        uVar64 = auVar73._0_4_;
        auVar112._0_4_ =
             (float)(uVar64 ^ (uint)(local_a00 * fVar15 +
                                    auVar35._0_4_ * fVar13 + auVar38._0_4_ * fVar14));
        uVar76 = auVar73._4_4_;
        auVar112._4_4_ =
             (float)(uVar76 ^ (uint)(fStack_9fc * fVar18 +
                                    auVar35._4_4_ * fVar16 + auVar38._4_4_ * fVar17));
        uVar77 = auVar73._8_4_;
        auVar112._8_4_ =
             (float)(uVar77 ^ (uint)(fStack_9f8 * fVar21 +
                                    auVar35._8_4_ * fVar19 + auVar38._8_4_ * fVar20));
        uVar78 = auVar73._12_4_;
        auVar112._12_4_ =
             (float)(uVar78 ^ (uint)(fStack_9f4 * fVar24 +
                                    auVar35._12_4_ * fVar22 + auVar38._12_4_ * fVar23));
        uVar79 = auVar73._16_4_;
        auVar112._16_4_ =
             (float)(uVar79 ^ (uint)(fStack_9f0 * fVar27 +
                                    auVar35._16_4_ * fVar25 + auVar38._16_4_ * fVar26));
        uVar80 = auVar73._20_4_;
        auVar112._20_4_ =
             (float)(uVar80 ^ (uint)(fStack_9ec * fVar30 +
                                    auVar35._20_4_ * fVar28 + auVar38._20_4_ * fVar29));
        uVar81 = auVar73._24_4_;
        auVar112._24_4_ =
             (float)(uVar81 ^ (uint)(fStack_9e8 * fVar33 +
                                    auVar35._24_4_ * fVar31 + auVar38._24_4_ * fVar32));
        uVar82 = auVar73._28_4_;
        auVar112._28_4_ = (float)(uVar82 ^ (uint)(fVar11 + auVar37._28_4_ + fVar10));
        auVar87._0_4_ =
             (float)(uVar64 ^ (uint)(local_a00 * fVar110 +
                                    auVar35._0_4_ * fVar90 + auVar38._0_4_ * fVar134));
        auVar87._4_4_ =
             (float)(uVar76 ^ (uint)(fStack_9fc * fVar113 +
                                    auVar35._4_4_ * fVar95 + auVar38._4_4_ * fVar135));
        auVar87._8_4_ =
             (float)(uVar77 ^ (uint)(fStack_9f8 * fVar115 +
                                    auVar35._8_4_ * fVar96 + auVar38._8_4_ * fVar136));
        auVar87._12_4_ =
             (float)(uVar78 ^ (uint)(fStack_9f4 * fVar117 +
                                    auVar35._12_4_ * fVar97 + auVar38._12_4_ * fVar137));
        auVar87._16_4_ =
             (float)(uVar79 ^ (uint)(fStack_9f0 * fVar119 +
                                    auVar35._16_4_ * fVar98 + auVar38._16_4_ * fVar138));
        auVar87._20_4_ =
             (float)(uVar80 ^ (uint)(fStack_9ec * fVar121 +
                                    auVar35._20_4_ * fVar99 + auVar38._20_4_ * fVar139));
        auVar87._24_4_ =
             (float)(uVar81 ^ (uint)(fStack_9e8 * fVar123 +
                                    auVar35._24_4_ * fVar100 + auVar38._24_4_ * fVar140));
        auVar87._28_4_ = (float)(uVar82 ^ (uint)(auVar38._28_4_ + auVar35._28_4_ + fVar9));
        auVar73 = vcmpps_avx(auVar112,ZEXT832(0) << 0x20,5);
        auVar34 = vcmpps_avx(auVar87,ZEXT832(0) << 0x20,5);
        auVar73 = vandps_avx(auVar73,auVar34);
        auVar34 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,4);
        auVar73 = vandps_avx(auVar73,auVar34);
        auVar103._0_4_ = auVar112._0_4_ + auVar87._0_4_;
        auVar103._4_4_ = auVar112._4_4_ + auVar87._4_4_;
        auVar103._8_4_ = auVar112._8_4_ + auVar87._8_4_;
        auVar103._12_4_ = auVar112._12_4_ + auVar87._12_4_;
        auVar103._16_4_ = auVar112._16_4_ + auVar87._16_4_;
        auVar103._20_4_ = auVar112._20_4_ + auVar87._20_4_;
        auVar103._24_4_ = auVar112._24_4_ + auVar87._24_4_;
        auVar103._28_4_ = auVar112._28_4_ + auVar87._28_4_;
        auVar88._8_4_ = 0x7fffffff;
        auVar88._0_8_ = 0x7fffffff7fffffff;
        auVar88._12_4_ = 0x7fffffff;
        auVar88._16_4_ = 0x7fffffff;
        auVar88._20_4_ = 0x7fffffff;
        auVar88._24_4_ = 0x7fffffff;
        auVar88._28_4_ = 0x7fffffff;
        auVar34 = vandps_avx(auVar127,auVar88);
        auVar35 = vcmpps_avx(auVar103,auVar34,2);
        auVar38 = auVar35 & auVar73;
        if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0x7f,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar38 >> 0xbf,0) != '\0') ||
            (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar38[0x1f] < '\0') {
          auVar73 = vandps_avx(auVar73,auVar35);
          auVar72 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          auVar75._0_4_ =
               uVar64 ^ (uint)(fVar111 * (float)local_a80._0_4_ +
                              fVar125 * (float)local_a60._0_4_ + fVar101 * auVar36._0_4_);
          auVar75._4_4_ =
               uVar76 ^ (uint)(fVar114 * (float)local_a80._4_4_ +
                              fVar128 * (float)local_a60._4_4_ + fVar104 * auVar36._4_4_);
          auVar75._8_4_ =
               uVar77 ^ (uint)(fVar116 * fStack_a78 + fVar129 * fStack_a58 + fVar105 * auVar36._8_4_
                              );
          auVar75._12_4_ =
               uVar78 ^ (uint)(fVar118 * fStack_a74 +
                              fVar130 * fStack_a54 + fVar106 * auVar36._12_4_);
          auVar75._16_4_ =
               uVar79 ^ (uint)(fVar120 * (float)uStack_a70 +
                              fVar131 * (float)uStack_a50 + fVar107 * auVar36._16_4_);
          auVar75._20_4_ =
               uVar80 ^ (uint)(fVar122 * uStack_a70._4_4_ +
                              fVar132 * uStack_a50._4_4_ + fVar108 * auVar36._20_4_);
          auVar75._24_4_ =
               uVar81 ^ (uint)(fVar124 * (float)uStack_a68 +
                              fVar133 * (float)uStack_a48 + fVar109 * auVar36._24_4_);
          auVar75._28_4_ = uVar82 ^ (uint)(auVar37._28_4_ + fVar46 + fVar43);
          fVar13 = *(float *)(ray + k * 4 + 0x60);
          auVar48._4_4_ = auVar34._4_4_ * fVar13;
          auVar48._0_4_ = auVar34._0_4_ * fVar13;
          auVar48._8_4_ = auVar34._8_4_ * fVar13;
          auVar48._12_4_ = auVar34._12_4_ * fVar13;
          auVar48._16_4_ = auVar34._16_4_ * fVar13;
          auVar48._20_4_ = auVar34._20_4_ * fVar13;
          auVar48._24_4_ = auVar34._24_4_ * fVar13;
          auVar48._28_4_ = fVar13;
          auVar73 = vcmpps_avx(auVar48,auVar75,1);
          fVar13 = *(float *)(ray + k * 4 + 0x100);
          auVar49._4_4_ = auVar34._4_4_ * fVar13;
          auVar49._0_4_ = auVar34._0_4_ * fVar13;
          auVar49._8_4_ = auVar34._8_4_ * fVar13;
          auVar49._12_4_ = auVar34._12_4_ * fVar13;
          auVar49._16_4_ = auVar34._16_4_ * fVar13;
          auVar49._20_4_ = auVar34._20_4_ * fVar13;
          auVar49._24_4_ = auVar34._24_4_ * fVar13;
          auVar49._28_4_ = auVar34._28_4_;
          auVar34 = vcmpps_avx(auVar75,auVar49,2);
          auVar73 = vandps_avx(auVar73,auVar34);
          auVar93 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          auVar72 = vpand_avx(auVar93,auVar72);
          auVar93 = vpmovzxwd_avx(auVar72);
          auVar89._0_16_ = vpslld_avx(auVar93,0x1f);
          auVar93 = vpunpckhwd_avx(auVar72,auVar72);
          auVar93 = vpslld_avx(auVar93,0x1f);
          auVar89._16_16_ = auVar93;
          if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar89 >> 0x7f,0) != '\0') ||
                (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar93 >> 0x3f,0) != '\0') ||
              (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar93[0xf] < '\0') {
            auVar72 = vpsllw_avx(auVar72,0xf);
            auVar72 = vpacksswb_avx(auVar72,auVar72);
            uVar57 = (ulong)(byte)(SUB161(auVar72 >> 7,0) & 1 | (SUB161(auVar72 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar72 >> 0x3f,0) << 7);
            do {
              uVar12 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              if ((((context->scene->geometries).items[*(uint *)((long)&local_820 + uVar12 * 4)].ptr
                   )->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                return bVar66;
              }
              uVar57 = uVar57 ^ 1L << (uVar12 & 0x3f);
            } while (uVar57 != 0);
          }
        }
        lVar56 = lVar56 + 1;
      } while (lVar56 != uVar55 - 8);
    }
LAB_003998b7:
    bVar66 = puVar59 != &local_800;
    if (!bVar66) {
      return bVar66;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }